

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_ctpop_i64_sparc64(TCGContext_conflict8 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1)

{
  TCGTemp *args [1];
  TCGTemp *local_8;
  
  local_8 = (TCGTemp *)(arg1 + (long)tcg_ctx);
  tcg_gen_callN_sparc64
            (tcg_ctx,helper_ctpop_i64_sparc64,(TCGTemp *)(ret + (long)tcg_ctx),1,&local_8);
  return;
}

Assistant:

void tcg_gen_ctpop_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1)
{
#if TCG_TARGET_HAS_ctpop_i64
        tcg_gen_op2_i64(tcg_ctx, INDEX_op_ctpop_i64, ret, arg1);
#elif TCG_TARGET_REG_BITS == 32 && TCG_TARGET_HAS_ctpop_i32
        tcg_gen_ctpop_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1));
        tcg_gen_ctpop_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1));
        tcg_gen_add_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, ret));
        tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
#else
        gen_helper_ctpop_i64(tcg_ctx, ret, arg1);
#endif
}